

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O0

void __thiscall duckdb::NestedValidity::SetInvalid(NestedValidity *this,idx_t idx)

{
  long lVar1;
  long in_RSI;
  long *in_RDI;
  unsigned_long bit_1;
  unsigned_long bit;
  idx_t list_idx_in_entry;
  idx_t list_entry_idx;
  byte local_20 [8];
  idx_t local_18;
  idx_t local_10;
  
  if (*in_RDI == 0) {
    lVar1 = *(long *)(in_RDI[1] + in_RSI * 8);
    *(byte *)(lVar1 + in_RDI[2]) =
         *(byte *)(lVar1 + in_RDI[2]) & ((byte)(1L << ((byte)in_RDI[3] & 0x3f)) ^ 0xff);
  }
  else {
    local_10 = in_RSI + in_RDI[4];
    TemplatedValidityMask<unsigned_char>::GetEntryIndex(local_10,&local_18,(idx_t *)local_20);
    *(byte *)(*in_RDI + local_18) =
         *(byte *)(*in_RDI + local_18) & ((byte)(1L << (local_20[0] & 0x3f)) ^ 0xff);
  }
  return;
}

Assistant:

void NestedValidity::SetInvalid(idx_t idx) {
	if (list_validity_location) {
		// Is List

		idx = idx + list_validity_offset;

		idx_t list_entry_idx;
		idx_t list_idx_in_entry;
		ValidityBytes::GetEntryIndex(idx, list_entry_idx, list_idx_in_entry);
		const auto bit = ~(1UL << list_idx_in_entry);
		list_validity_location[list_entry_idx] &= bit;
	} else {
		// Is Struct
		const auto bit = ~(1UL << idx_in_entry);
		*(struct_validity_locations[idx] + entry_idx) &= bit;
	}
}